

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMSlicer.h
# Opt level: O2

void __thiscall
dg::llvmdg::LLVMSlicer::sliceGraph(LLVMSlicer *this,LLVMDependenceGraph *graph,uint32_t slice_id)

{
  SlicerStatistics *pSVar1;
  uint64_t *puVar2;
  LLVMNode *n;
  Value *pVVar3;
  _Rb_tree_node_base *p_Var4;
  
  Slicer<dg::LLVMNode>::sliceBBlocks
            (&this->super_Slicer<dg::LLVMNode>,(DependenceGraph<dg::LLVMNode> *)graph,slice_id);
  adjustBBlocksSucessors(graph,slice_id);
  p_Var4 = *(_Rb_tree_node_base **)(graph + 0xc0);
  while (p_Var4 != (_Rb_tree_node_base *)(graph + 0xb0)) {
    n = (LLVMNode *)p_Var4[1]._M_parent;
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    if (n != *(LLVMNode **)(graph + 0x20)) {
      pSVar1 = &(this->super_Slicer<dg::LLVMNode>).statistics;
      pSVar1->nodesTotal = pSVar1->nodesTotal + 1;
      pVVar3 = (n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).key;
      if (((pVVar3 == (Value *)0x0) || (pVVar3[0x10] != (Value)0x22)) &&
         ((n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).slice_id != slice_id
         )) {
        (**(this->super_Slicer<dg::LLVMNode>)._vptr_Slicer)(this,n);
        DependenceGraph<dg::LLVMNode>::deleteNode((DependenceGraph<dg::LLVMNode> *)graph,n);
        puVar2 = &(this->super_Slicer<dg::LLVMNode>).statistics.nodesRemoved;
        *puVar2 = *puVar2 + 1;
      }
    }
  }
  reconnectLLLVMBasicBlocks(graph);
  ensureEntryBlock(graph);
  return;
}

Assistant:

void sliceGraph(LLVMDependenceGraph *graph, uint32_t slice_id) {
        // first slice away bblocks that should go away
        sliceBBlocks(graph, slice_id);

        // make graph complete
        adjustBBlocksSucessors(graph, slice_id);

        // now slice away instructions from BBlocks that left
        for (auto I = graph->begin(), E = graph->end(); I != E;) {
            LLVMNode *n = I->second;
            // shift here, so that we won't corrupt the iterator
            // by deleteing the node
            ++I;

            // we added this node artificially and
            // we don't want to slice it away or
            // take any other action on it
            if (n == graph->getExit())
                continue;

            ++statistics.nodesTotal;

            // keep instructions like ret or unreachable
            // FIXME: if this is ret of some value, then
            // the value is undef now, so we should
            // replace it by void ref
            if (!shouldSliceInst(n->getKey()))
                continue;

            /*
            if (llvm::isa<llvm::CallInst>(n->getKey()))
                sliceCallNode(n, slice_id);
                */

            if (n->getSlice() != slice_id) {
                removeNode(n);
                graph->deleteNode(n);
                ++statistics.nodesRemoved;
            }
        }

        // create new CFG edges between blocks after slicing
        reconnectLLLVMBasicBlocks(graph);

        // if we sliced away entry block, our new entry block
        // may have predecessors, which is not allowed in the
        // LLVM
        ensureEntryBlock(graph);
    }